

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

void __thiscall
amrex::FabArrayBase::CPC::define
          (CPC *this,BoxArray *ba_dst,DistributionMapping *dm_dst,
          Vector<int,_std::allocator<int>_> *imap_dst,BoxArray *ba_src,DistributionMapping *dm_src,
          Vector<int,_std::allocator<int>_> *imap_src,int MyProc)

{
  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  pointer *ppCVar2;
  undefined8 uVar3;
  int iVar4;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *__ptr;
  iterator iVar5;
  _Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  this_01;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *pmVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  void *pvVar14;
  bool bVar15;
  pointer ppVar16;
  Box *pBVar17;
  Box *pBVar18;
  undefined4 uVar19;
  IntVect *pIVar20;
  pointer pBVar21;
  bool bVar22;
  int iVar23;
  pointer __p;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *pvVar24
  ;
  pointer pmVar25;
  mapped_type *pmVar26;
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  *puVar27;
  _Rb_tree_node_base *p_Var28;
  int iVar29;
  int iVar30;
  pointer piVar31;
  ulong uVar32;
  pointer pIVar33;
  IndexType IVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  Box *b;
  pointer pBVar38;
  Box *btile;
  pointer piVar39;
  pointer pBVar40;
  Box r;
  int src_owner;
  BoxList bl_local;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box r_2;
  BoxList bl_remote;
  BoxList bl_dst_1;
  BoxList tilelist;
  undefined1 local_228 [104];
  pointer local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  int local_19c;
  BoxList local_198;
  undefined1 local_178 [16];
  pointer local_168;
  IntVect *local_158;
  ulong local_150;
  IntVect *local_148;
  ulong local_140;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *local_138;
  long local_130;
  Box *local_128;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_120;
  Vector<int,_std::allocator<int>_> *local_108;
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  *local_100;
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  *local_f8;
  BoxArray *local_f0;
  DistributionMapping *local_e8;
  DistributionMapping *local_e0;
  Box local_d8;
  Box local_bc;
  BoxList local_a0;
  ulong local_80;
  unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  *local_78;
  BoxList local_70;
  BoxList local_50;
  
  local_108 = imap_dst;
  local_f0 = ba_src;
  local_e8 = dm_src;
  local_e0 = dm_dst;
  pvVar24 = (vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
             *)operator_new(0x18);
  *(undefined1 (*) [16])
   &(pvVar24->
    super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
    )._M_impl = (undefined1  [16])0x0;
  *(pointer *)
   ((long)&(pvVar24->
           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
           )._M_impl + 0x10) = (pointer)0x0;
  this_00 = &(this->super_CommMetaData).m_LocTags;
  __ptr = (this->super_CommMetaData).m_LocTags._M_t.
          super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
          .
          super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
          ._M_head_impl;
  (this->super_CommMetaData).m_LocTags._M_t.
  super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
  .
  super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
  ._M_head_impl = pvVar24;
  if (__ptr != (vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                *)0x0) {
    std::
    default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
    ::operator()((default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>
                  *)this_00,__ptr);
  }
  pmVar25 = (pointer)operator_new(0x30);
  p_Var1 = &(pmVar25->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined1 (*) [16])&(pmVar25->_M_t)._M_impl = (undefined1  [16])0x0;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_100 = &(this->super_CommMetaData).m_SndTags;
  local_228._0_8_ =
       (__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        )0x0;
  std::
  __uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           *)local_100,pmVar25);
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                 *)local_228);
  pmVar25 = (pointer)operator_new(0x30);
  p_Var1 = &(pmVar25->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined1 (*) [16])&(pmVar25->_M_t)._M_impl = (undefined1  [16])0x0;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8 = &(this->super_CommMetaData).m_RcvTags;
  local_228._0_8_ =
       (__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
        )0x0;
  std::
  __uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
           *)local_f8,pmVar25);
  std::
  unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                 *)local_228);
  local_158 = (IntVect *)
              (local_108->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  ;
  local_1c0 = (local_108->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  if (local_158 == (IntVect *)local_1c0) {
    piVar31 = (imap_src->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    piVar39 = (imap_src->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
    if (piVar31 == piVar39) {
      return;
    }
  }
  else {
    piVar31 = (imap_src->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    piVar39 = (imap_src->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  local_178 = (undefined1  [16])0x0;
  local_168 = (pointer)0x0;
  local_78 = this_00;
  Periodicity::shiftIntVect(&local_120,&this->m_period);
  local_1b8 = (ulong)((long)piVar39 - (long)piVar31) >> 2;
  if (0 < (int)(uint)local_1b8) {
    local_148 = &this->m_dstng;
    local_128 = (Box *)(local_100->_M_t).
                       super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
                       .
                       super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
                       ._M_head_impl;
    local_1b8 = (ulong)((uint)local_1b8 & 0x7fffffff);
    uVar32 = 0;
    do {
      iVar4 = (imap_src->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar32];
      local_130 = (long)iVar4;
      local_150 = uVar32;
      BATransformer::operator()
                ((Box *)local_228,&local_f0->m_bat,
                 (Box *)(local_130 * 0x1c +
                        *(long *)&(((local_f0->m_ref).
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      if (local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar19 = local_228._24_4_;
        iVar36 = (this->m_srcng).vect[0];
        iVar37 = (this->m_srcng).vect[1];
        local_138 = (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                     *)CONCAT44(local_138._4_4_,local_228._0_4_ - iVar36);
        local_140 = CONCAT44(local_140._4_4_,local_228._4_4_ - iVar37);
        iVar23 = (this->m_srcng).vect[2];
        local_1b0 = CONCAT44(local_1b0._4_4_,local_228._8_4_ - iVar23);
        iVar36 = iVar36 + local_228._12_4_;
        iVar37 = iVar37 + local_228._16_4_;
        iVar23 = iVar23 + local_228._20_4_;
        pIVar33 = local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_228._4_4_ = pIVar33->vect[1] + (int)local_140;
          local_228._0_4_ = pIVar33->vect[0] + (int)local_138;
          local_228._8_4_ = pIVar33->vect[2] + (int)local_1b0;
          local_228._12_4_ = pIVar33->vect[0] + iVar36;
          local_228._16_4_ = pIVar33->vect[1] + iVar37;
          local_228._20_4_ = pIVar33->vect[2] + iVar23;
          local_228._20_8_ = CONCAT44(uVar19,local_228._20_4_);
          BoxArray::intersections
                    (ba_dst,(Box *)local_228,
                     (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)local_178,false,local_148);
          local_1a8 = (ulong)(local_178._8_8_ - local_178._0_8_) >> 5;
          if (0 < (int)(uint)local_1a8) {
            local_1a8 = (ulong)((uint)local_1a8 & 0x7fffffff);
            uVar32 = 0;
            do {
              iVar30 = ((pointer)(local_178._0_8_ + uVar32 * 0x20))->first;
              local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ =
                   *(int *)(*(long *)&(((local_e0->m_ref).
                                        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl +
                           (long)iVar30 * 4);
              if ((int)local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_start < 0) {
                iVar29 = 0;
              }
              else {
                iVar29 = (int)local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start -
                         (int)local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_start %
                         (int)ParallelDescriptor::m_Team._4_4_;
              }
              if ((ParallelDescriptor::m_Team._12_4_ != iVar29) &&
                 (*(int *)(*(long *)&(((local_e8->m_ref).
                                       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl +
                          local_130 * 4) == MyProc)) {
                ppVar16 = (pointer)(local_178._0_8_ + uVar32 * 0x20);
                if (this->m_tgco == true) {
                  BATransformer::operator()
                            ((Box *)local_228,&ba_dst->m_bat,
                             (Box *)((long)iVar30 * 0x1c +
                                    *(long *)&(((ba_dst->m_ref).
                                                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->m_abox).
                                              super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                              ._M_impl.super__Vector_impl_data));
                  boxDiff(&local_198,&ppVar16->second,(Box *)local_228);
                  pBVar17 = local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pBVar18 = local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                else {
                  BoxList::BoxList(&local_198,&ppVar16->second);
                  pBVar17 = local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pBVar18 = local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                for (; pBVar38 = local_198.m_lbox.
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_finish,
                    pBVar17 !=
                    local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish; pBVar17 = pBVar17 + 1) {
                  local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish = pBVar18;
                  pmVar26 = std::
                            map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                            ::operator[]((map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                                          *)local_128,(key_type *)&local_a0);
                  local_228._52_4_ = (pBVar17->btype).itype;
                  uVar3 = *(undefined8 *)((pBVar17->bigend).vect + 1);
                  local_228._32_4_ = (undefined4)*(undefined8 *)(pIVar33->vect + 1);
                  local_228._44_4_ = (int)uVar3 - local_228._32_4_;
                  local_228._36_4_ = (undefined4)((ulong)*(undefined8 *)(pIVar33->vect + 1) >> 0x20)
                  ;
                  local_228._48_4_ = (int)((ulong)uVar3 >> 0x20) - local_228._36_4_;
                  local_228._28_4_ = (pBVar17->smallend).vect[0] - pIVar33->vect[0];
                  local_228._32_4_ = (pBVar17->smallend).vect[1] - local_228._32_4_;
                  local_228._36_4_ = (pBVar17->smallend).vect[2] - local_228._36_4_;
                  local_228._40_4_ = (pBVar17->bigend).vect[0] - pIVar33->vect[0];
                  local_228._0_8_ = *(undefined8 *)(pBVar17->smallend).vect;
                  piVar10 = (pBVar17->smallend).vect + 2;
                  local_228._8_4_ = *piVar10;
                  local_228._12_4_ = (pBVar17->bigend).vect[0];
                  uVar3 = *(undefined8 *)piVar10;
                  local_228._20_8_ = *(undefined8 *)((pBVar17->bigend).vect + 2);
                  local_228._16_4_ =
                       (undefined4)((ulong)*(undefined8 *)(pBVar17->bigend).vect >> 0x20);
                  iVar5._M_current =
                       (pmVar26->
                       super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  local_228._56_4_ = iVar30;
                  local_228._60_4_ = iVar4;
                  if (iVar5._M_current ==
                      (pmVar26->
                      super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                    ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>
                              (pmVar26,iVar5,(CopyComTag *)local_228);
                  }
                  else {
                    *(ulong *)(((iVar5._M_current)->sbox).bigend.vect + 2) =
                         CONCAT44(local_228._52_4_,local_228._48_4_);
                    (iVar5._M_current)->dstIndex = iVar30;
                    (iVar5._M_current)->srcIndex = iVar4;
                    *(ulong *)(((iVar5._M_current)->sbox).smallend.vect + 1) =
                         CONCAT44(local_228._36_4_,local_228._32_4_);
                    *(ulong *)((iVar5._M_current)->sbox).bigend.vect =
                         CONCAT44(local_228._44_4_,local_228._40_4_);
                    ((iVar5._M_current)->dbox).bigend.vect[1] = local_228._16_4_;
                    ((iVar5._M_current)->dbox).bigend.vect[2] = local_228._20_4_;
                    ((iVar5._M_current)->dbox).btype.itype = local_228._24_4_;
                    ((iVar5._M_current)->sbox).smallend.vect[0] = local_228._28_4_;
                    *(undefined8 *)((iVar5._M_current)->dbox).smallend.vect = local_228._0_8_;
                    *(undefined8 *)(((iVar5._M_current)->dbox).smallend.vect + 2) = uVar3;
                    ppCVar2 = &(pmVar26->
                               super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppCVar2 = *ppCVar2 + 1;
                  }
                  pBVar18 = local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish = pBVar38;
                }
                local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish = pBVar18;
                if (local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start != (Box *)0x0) {
                  operator_delete(local_198.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_198.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_198.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != local_1a8);
          }
          pIVar33 = pIVar33 + 1;
        } while (pIVar33 !=
                 local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      uVar32 = local_150 + 1;
    } while (uVar32 != local_1b8);
  }
  IVar34.itype = 0;
  switch((ba_dst->m_bat).m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    IVar34.itype = (ba_dst->m_bat).m_op.m_indexType.m_typ.itype;
    break;
  default:
    IVar34.itype = (ba_dst->m_bat).m_op.m_bndryReg.m_typ.itype;
  }
  local_138 = (local_f8->_M_t).
              super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
              .
              super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
              ._M_head_impl;
  BoxList::BoxList(&local_198,IVar34);
  pIVar20 = local_158;
  IVar34.itype = 0;
  switch((ba_dst->m_bat).m_bat_type) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    IVar34.itype = (ba_dst->m_bat).m_op.m_indexType.m_typ.itype;
    break;
  default:
    IVar34.itype = (ba_dst->m_bat).m_op.m_bndryReg.m_typ.itype;
  }
  BoxList::BoxList(&local_a0,IVar34);
  local_1c0 = (pointer)((ulong)((long)local_1c0 - (long)pIVar20) >> 2);
  if (0 < (int)(uint)local_1c0) {
    local_158 = &this->m_srcng;
    local_130 = CONCAT44(local_130._4_4_,ParallelDescriptor::m_Team._4_4_);
    local_1c0 = (pointer)(ulong)((uint)local_1c0 & 0x7fffffff);
    uVar32 = 0;
    do {
      iVar4 = (local_108->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar32];
      local_1a8 = (ulong)iVar4;
      local_80 = uVar32;
      BATransformer::operator()
                (&local_bc,&ba_dst->m_bat,
                 (Box *)(local_1a8 * 0x1c +
                        *(long *)&(((ba_dst->m_ref).
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      IVar34.itype = local_bc.btype.itype;
      if (local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar36 = (this->m_dstng).vect[0];
        iVar37 = (this->m_dstng).vect[1];
        iVar30 = local_bc.smallend.vect[0] - iVar36;
        iVar29 = local_bc.smallend.vect[1] - iVar37;
        iVar23 = (this->m_dstng).vect[2];
        iVar35 = local_bc.smallend.vect[2] - iVar23;
        local_148 = (IntVect *)CONCAT44(local_148._4_4_,iVar36 + local_bc.bigend.vect[0]);
        local_150 = CONCAT44(local_150._4_4_,iVar37 + local_bc.bigend.vect[1]);
        local_1b8 = CONCAT44(local_1b8._4_4_,iVar23 + local_bc.bigend.vect[2]);
        pIVar33 = local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_228._4_4_ = pIVar33->vect[1] + iVar29;
          local_228._0_4_ = pIVar33->vect[0] + iVar30;
          local_228._8_4_ = pIVar33->vect[2] + iVar35;
          local_228._12_4_ = pIVar33->vect[0] + (int)local_148;
          local_228._16_4_ = pIVar33->vect[1] + (int)local_150;
          local_228._24_4_ = IVar34.itype;
          local_228._20_4_ = pIVar33->vect[2] + (int)local_1b8;
          BoxArray::intersections
                    (local_f0,(Box *)local_228,
                     (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)local_178,false,local_158);
          local_1b0 = (ulong)(local_178._8_8_ - local_178._0_8_) >> 5;
          if (0 < (int)(uint)local_1b0) {
            local_1b0 = (ulong)((uint)local_1b0 & 0x7fffffff);
            uVar32 = 0;
            do {
              iVar36 = ((pointer)(local_178._0_8_ + uVar32 * 0x20))->first;
              uVar3 = *(undefined8 *)
                       (((pointer)(local_178._0_8_ + uVar32 * 0x20))->second).smallend.vect;
              uVar12 = *(undefined8 *)
                        ((((pointer)(local_178._0_8_ + uVar32 * 0x20))->second).smallend.vect + 2);
              uVar13 = *(undefined8 *)
                        ((((pointer)(local_178._0_8_ + uVar32 * 0x20))->second).bigend.vect + 2);
              local_d8.bigend.vect[1] =
                   (int)((ulong)*(undefined8 *)
                                 (((pointer)(local_178._0_8_ + uVar32 * 0x20))->second).bigend.vect
                        >> 0x20);
              local_d8.smallend.vect[2] = (int)uVar12;
              local_d8.bigend.vect[0] = (int)((ulong)uVar12 >> 0x20);
              local_d8.smallend.vect[1] =
                   (int)((ulong)uVar3 >> 0x20) - (int)((ulong)*(undefined8 *)pIVar33->vect >> 0x20);
              local_d8.smallend.vect[0] = (int)uVar3 - (int)*(undefined8 *)pIVar33->vect;
              local_d8.smallend.vect[2] = local_d8.smallend.vect[2] - pIVar33->vect[2];
              local_d8.bigend.vect[0] = local_d8.bigend.vect[0] - pIVar33->vect[0];
              local_d8.bigend.vect[1] = local_d8.bigend.vect[1] - pIVar33->vect[1];
              local_d8.bigend.vect[2] = (int)uVar13;
              local_d8.btype.itype = (uint)((ulong)uVar13 >> 0x20);
              local_d8.bigend.vect[2] = local_d8.bigend.vect[2] - pIVar33->vect[2];
              local_19c = *(int *)(*(long *)&(((local_e8->m_ref).
                                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->m_pmap).
                                             super_vector<int,_std::allocator<int>_>.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  (long)iVar36 * 4);
              if (this->m_tgco == true) {
                boxDiff(&local_70,&local_d8,&local_bc);
              }
              else {
                BoxList::BoxList(&local_70,&local_d8);
              }
              local_128 = local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              pBVar38 = local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_start;
              local_140 = uVar32;
              if (local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                do {
                  iVar23 = 0;
                  iVar37 = 0;
                  if (-1 < local_19c) {
                    iVar37 = local_19c - local_19c % (int)ParallelDescriptor::m_Team._4_4_;
                  }
                  if (-1 < MyProc) {
                    iVar23 = MyProc - MyProc % (int)ParallelDescriptor::m_Team._4_4_;
                  }
                  if (iVar37 == iVar23) {
                    BoxList::BoxList(&local_50,pBVar38,(IntVect *)&comm_tile_size);
                    pBVar21 = local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                    for (pBVar40 = local_50.m_lbox.
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start; pBVar40 != pBVar21;
                        pBVar40 = pBVar40 + 1) {
                      this_01.
                      super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                      ._M_head_impl =
                           (local_78->_M_t).
                           super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                      ;
                      local_228._52_4_ = (pBVar40->btype).itype;
                      uVar3 = *(undefined8 *)((pBVar40->bigend).vect + 1);
                      local_228._32_4_ = (undefined4)*(undefined8 *)(pIVar33->vect + 1);
                      local_228._44_4_ = (int)uVar3 + local_228._32_4_;
                      local_228._36_4_ =
                           (undefined4)((ulong)*(undefined8 *)(pIVar33->vect + 1) >> 0x20);
                      local_228._48_4_ = (int)((ulong)uVar3 >> 0x20) + local_228._36_4_;
                      local_228._28_4_ = pIVar33->vect[0] + (pBVar40->smallend).vect[0];
                      local_228._32_4_ = local_228._32_4_ + (pBVar40->smallend).vect[1];
                      local_228._36_4_ = local_228._36_4_ + (pBVar40->smallend).vect[2];
                      local_228._40_4_ = pIVar33->vect[0] + (pBVar40->bigend).vect[0];
                      local_228._0_8_ = *(undefined8 *)(pBVar40->smallend).vect;
                      uVar3 = *(undefined8 *)((pBVar40->smallend).vect + 2);
                      local_228._20_8_ = *(undefined8 *)((pBVar40->bigend).vect + 2);
                      local_228._16_4_ =
                           (undefined4)((ulong)*(undefined8 *)(pBVar40->bigend).vect >> 0x20);
                      local_228._8_4_ = (undefined4)uVar3;
                      local_228._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                      iVar5._M_current =
                           *(pointer *)
                            ((long)this_01.
                                   super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                   ._M_head_impl + 8);
                      if (iVar5._M_current ==
                          *(pointer *)
                           ((long)this_01.
                                  super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                  ._M_head_impl + 0x10)) {
                        local_228._56_4_ = iVar4;
                        local_228._60_4_ = iVar36;
                        std::
                        vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                        ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>
                                  ((vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                    *)this_01.
                                      super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                      ._M_head_impl,iVar5,(CopyComTag *)local_228);
                      }
                      else {
                        *(ulong *)(((iVar5._M_current)->sbox).bigend.vect + 2) =
                             CONCAT44(local_228._52_4_,local_228._48_4_);
                        (iVar5._M_current)->dstIndex = iVar4;
                        (iVar5._M_current)->srcIndex = iVar36;
                        *(ulong *)(((iVar5._M_current)->sbox).smallend.vect + 1) =
                             CONCAT44(local_228._36_4_,local_228._32_4_);
                        *(ulong *)((iVar5._M_current)->sbox).bigend.vect =
                             CONCAT44(local_228._44_4_,local_228._40_4_);
                        ((iVar5._M_current)->dbox).bigend.vect[1] = local_228._16_4_;
                        ((iVar5._M_current)->dbox).bigend.vect[2] = local_228._20_4_;
                        ((iVar5._M_current)->dbox).btype.itype = local_228._24_4_;
                        ((iVar5._M_current)->sbox).smallend.vect[0] = local_228._28_4_;
                        *(undefined8 *)((iVar5._M_current)->dbox).smallend.vect = local_228._0_8_;
                        *(undefined8 *)(((iVar5._M_current)->dbox).smallend.vect + 2) = uVar3;
                        *(pointer *)
                         ((long)this_01.
                                super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                ._M_head_impl + 8) =
                             *(pointer *)
                              ((long)this_01.
                                     super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                                     ._M_head_impl + 8) + 1;
                        local_228._56_4_ = iVar4;
                        local_228._60_4_ = iVar36;
                      }
                    }
                    if (1 < (int)local_130) {
                      if (local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<amrex::Box,std::allocator<amrex::Box>>::
                        _M_realloc_insert<amrex::Box_const&>
                                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_198,
                                   (iterator)
                                   local_198.m_lbox.
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,pBVar38);
                      }
                      else {
                        uVar3 = *(undefined8 *)(pBVar38->smallend).vect;
                        uVar12 = *(undefined8 *)((pBVar38->smallend).vect + 2);
                        iVar37 = (pBVar38->bigend).vect[1];
                        iVar23 = (pBVar38->bigend).vect[2];
                        uVar11 = (pBVar38->btype).itype;
                        ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish)->bigend).vect[0] =
                             (pBVar38->bigend).vect[0];
                        ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish)->bigend).vect[1] = iVar37;
                        ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish)->bigend).vect[2] = iVar23;
                        ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish)->btype).itype = uVar11;
                        *(undefined8 *)
                         ((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->smallend).vect = uVar3;
                        *(undefined8 *)
                         (((local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish)->smallend).vect + 2) = uVar12;
                        local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                    }
                    if (local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_50.m_lbox.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (long)local_50.m_lbox.
                                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_50.m_lbox.
                                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  else if (*(int *)(*(long *)&(((local_e0->m_ref).
                                                super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->m_pmap).
                                              super_vector<int,_std::allocator<int>_>.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                   + local_1a8 * 4) == MyProc) {
                    pmVar26 = std::
                              map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                              ::operator[](local_138,&local_19c);
                    local_228._52_4_ = (pBVar38->btype).itype;
                    uVar3 = *(undefined8 *)((pBVar38->bigend).vect + 1);
                    local_228._32_4_ = (undefined4)*(undefined8 *)(pIVar33->vect + 1);
                    local_228._44_4_ = (int)uVar3 + local_228._32_4_;
                    local_228._36_4_ =
                         (undefined4)((ulong)*(undefined8 *)(pIVar33->vect + 1) >> 0x20);
                    local_228._48_4_ = (int)((ulong)uVar3 >> 0x20) + local_228._36_4_;
                    local_228._28_4_ = pIVar33->vect[0] + (pBVar38->smallend).vect[0];
                    local_228._32_4_ = local_228._32_4_ + (pBVar38->smallend).vect[1];
                    local_228._36_4_ = local_228._36_4_ + (pBVar38->smallend).vect[2];
                    local_228._40_4_ = pIVar33->vect[0] + (pBVar38->bigend).vect[0];
                    local_228._0_8_ = *(undefined8 *)(pBVar38->smallend).vect;
                    uVar3 = *(undefined8 *)((pBVar38->smallend).vect + 2);
                    local_228._20_8_ = *(undefined8 *)((pBVar38->bigend).vect + 2);
                    local_228._16_4_ =
                         (undefined4)((ulong)*(undefined8 *)(pBVar38->bigend).vect >> 0x20);
                    local_228._8_4_ = (undefined4)uVar3;
                    local_228._12_4_ = (undefined4)((ulong)uVar3 >> 0x20);
                    iVar5._M_current =
                         (pmVar26->
                         super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                    if (iVar5._M_current ==
                        (pmVar26->
                        super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      local_228._56_4_ = iVar4;
                      local_228._60_4_ = iVar36;
                      std::
                      vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                      ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>
                                (pmVar26,iVar5,(CopyComTag *)local_228);
                    }
                    else {
                      *(ulong *)(((iVar5._M_current)->sbox).bigend.vect + 2) =
                           CONCAT44(local_228._52_4_,local_228._48_4_);
                      (iVar5._M_current)->dstIndex = iVar4;
                      (iVar5._M_current)->srcIndex = iVar36;
                      *(ulong *)(((iVar5._M_current)->sbox).smallend.vect + 1) =
                           CONCAT44(local_228._36_4_,local_228._32_4_);
                      *(ulong *)((iVar5._M_current)->sbox).bigend.vect =
                           CONCAT44(local_228._44_4_,local_228._40_4_);
                      ((iVar5._M_current)->dbox).bigend.vect[1] = local_228._16_4_;
                      ((iVar5._M_current)->dbox).bigend.vect[2] = local_228._20_4_;
                      ((iVar5._M_current)->dbox).btype.itype = local_228._24_4_;
                      ((iVar5._M_current)->sbox).smallend.vect[0] = local_228._28_4_;
                      *(undefined8 *)((iVar5._M_current)->dbox).smallend.vect = local_228._0_8_;
                      *(undefined8 *)(((iVar5._M_current)->dbox).smallend.vect + 2) = uVar3;
                      ppCVar2 = &(pmVar26->
                                 super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                      *ppCVar2 = *ppCVar2 + 1;
                      local_228._56_4_ = iVar4;
                      local_228._60_4_ = iVar36;
                    }
                  }
                  pBVar38 = pBVar38 + 1;
                } while (pBVar38 != local_128);
              }
              if (local_70.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start != (Box *)0x0) {
                operator_delete(local_70.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_70.m_lbox.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_70.m_lbox.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              uVar32 = local_140 + 1;
            } while (uVar32 != local_1b0);
          }
          pIVar33 = pIVar33 + 1;
        } while (pIVar33 !=
                 local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      uVar32 = local_80 + 1;
    } while ((pointer)uVar32 != local_1c0);
  }
  if ((long)local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start < 0x38) {
    (this->super_CommMetaData).m_threadsafe_loc = true;
  }
  else {
    BoxArray::BoxArray((BoxArray *)local_228,&local_198);
    bVar22 = BoxArray::isDisjoint((BoxArray *)local_228);
    (this->super_CommMetaData).m_threadsafe_loc = bVar22;
    BoxArray::~BoxArray((BoxArray *)local_228);
  }
  if ((long)local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish -
      CONCAT44(local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_,
               (int)local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start) < 0x38) {
    (this->super_CommMetaData).m_threadsafe_rcv = true;
  }
  else {
    BoxArray::BoxArray((BoxArray *)local_228,&local_a0);
    bVar22 = BoxArray::isDisjoint((BoxArray *)local_228);
    (this->super_CommMetaData).m_threadsafe_rcv = bVar22;
    BoxArray::~BoxArray((BoxArray *)local_228);
  }
  bVar22 = true;
  do {
    bVar15 = bVar22;
    puVar27 = local_f8;
    if (bVar15) {
      puVar27 = local_100;
    }
    pmVar6 = (puVar27->_M_t).
             super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
             .
             super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
             ._M_head_impl;
    for (p_Var28 = *(_Base_ptr *)((long)&(pmVar6->_M_t)._M_impl + 0x18);
        p_Var28 != (_Rb_tree_node_base *)((long)&(pmVar6->_M_t)._M_impl + 8U);
        p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28)) {
      p_Var7 = p_Var28[1]._M_parent;
      p_Var8 = p_Var28[1]._M_left;
      if (p_Var7 != p_Var8) {
        uVar32 = (long)p_Var8 - (long)p_Var7 >> 6;
        lVar9 = 0x3f;
        if (uVar32 != 0) {
          for (; uVar32 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var8,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var7,p_Var8);
      }
    }
    bVar22 = false;
  } while (bVar15);
  pvVar14 = (void *)CONCAT44(local_a0.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (int)local_a0.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar14 != (void *)0x0) {
    operator_delete(pvVar14,(long)local_a0.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar14)
    ;
  }
  if (local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (Box *)0x0) {
    operator_delete(local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_178._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_178._0_8_,(long)local_168 - local_178._0_8_);
  }
  return;
}

Assistant:

void
FabArrayBase::CPC::define (const BoxArray& ba_dst, const DistributionMapping& dm_dst,
                           const Vector<int>& imap_dst,
                           const BoxArray& ba_src, const DistributionMapping& dm_src,
                           const Vector<int>& imap_src,
                           int MyProc)
{
    BL_PROFILE("FabArrayBase::CPC::define()");

    BL_ASSERT(ba_dst.size() > 0 && ba_src.size() > 0);
    BL_ASSERT(ba_dst.ixType() == ba_src.ixType());

    m_LocTags = std::make_unique<CopyComTag::CopyComTagsContainer>();
    m_SndTags = std::make_unique<CopyComTag::MapOfCopyComTagContainers>();
    m_RcvTags = std::make_unique<CopyComTag::MapOfCopyComTagContainers>();

    if (!(imap_dst.empty() && imap_src.empty()))
    {
        const int nlocal_src = imap_src.size();
        const IntVect& ng_src = m_srcng;
        const int nlocal_dst = imap_dst.size();
        const IntVect& ng_dst = m_dstng;

        std::vector< std::pair<int,Box> > isects;

        const std::vector<IntVect>& pshifts = m_period.shiftIntVect();

        auto& send_tags = *m_SndTags;

        for (int i = 0; i < nlocal_src; ++i)
        {
            const int   k_src = imap_src[i];
            const Box& bx_src = amrex::grow(ba_src[k_src], ng_src);

            for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
            {
                ba_dst.intersections(bx_src+(*pit), isects, false, ng_dst);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int k_dst     = isects[j].first;
                    const Box& bx       = isects[j].second;
                    const int dst_owner = dm_dst[k_dst];

                    if (ParallelDescriptor::sameTeam(dst_owner)) {
                        continue; // local copy will be dealt with later
                    } else if (MyProc == dm_src[k_src]) {
                        BoxList const bl_dst = m_tgco ? boxDiff(bx, ba_dst[k_dst]) : BoxList(bx);
                        for (auto const& b : bl_dst) {
                            send_tags[dst_owner].push_back(CopyComTag(b, b-(*pit), k_dst, k_src));
                        }
                    }
                }
            }
        }

        auto& recv_tags = *m_RcvTags;

        BoxList bl_local(ba_dst.ixType());
        BoxList bl_remote(ba_dst.ixType());

        bool check_local = false, check_remote = false;
#if defined(AMREX_USE_GPU)
        check_local = true;
        check_remote = true;
#elif defined(AMREX_USE_OMP)
        if (omp_get_max_threads() > 1) {
            check_local = true;
            check_remote = true;
        }
#endif

        if (ParallelDescriptor::TeamSize() > 1) {
            check_local = true;
        }

        for (int i = 0; i < nlocal_dst; ++i)
        {
            const int   k_dst = imap_dst[i];
            const Box& bx_dst_valid = ba_dst[k_dst];
            const Box& bx_dst = amrex::grow(bx_dst_valid, ng_dst);

            for (std::vector<IntVect>::const_iterator pit=pshifts.begin(); pit!=pshifts.end(); ++pit)
            {
                ba_src.intersections(bx_dst+(*pit), isects, false, ng_src);

                for (int j = 0, M = isects.size(); j < M; ++j)
                {
                    const int k_src     = isects[j].first;
                    const Box& bx       = isects[j].second - *pit;
                    const int src_owner = dm_src[k_src];

                    BoxList const bl_dst = m_tgco ? boxDiff(bx,bx_dst_valid) : BoxList(bx);
                    for (auto const& b : bl_dst) {
                        if (ParallelDescriptor::sameTeam(src_owner, MyProc)) { // local copy
                            const BoxList tilelist(b, FabArrayBase::comm_tile_size);
                            for (auto const& btile : tilelist) {
                                m_LocTags->push_back(CopyComTag(btile, btile+(*pit), k_dst, k_src));
                            }
                            if (check_local) {
                                bl_local.push_back(b);
                            }
                        } else if (MyProc == dm_dst[k_dst]) {
                            recv_tags[src_owner].push_back(CopyComTag(b, b+(*pit), k_dst, k_src));
                            if (check_remote) {
                                bl_remote.push_back(b);
                            }
                        }
                    }
                }
            }
        }

        if (bl_local.size() <= 1) {
            m_threadsafe_loc = true;
        } else {
            m_threadsafe_loc = BoxArray(std::move(bl_local)).isDisjoint();
        }

        if (bl_remote.size() <= 1) {
            m_threadsafe_rcv = true;
        } else {
            m_threadsafe_rcv = BoxArray(std::move(bl_remote)).isDisjoint();
        }

        for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
        {
            CopyComTag::MapOfCopyComTagContainers & Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
            for (auto& kv : Tags)
            {
                std::vector<CopyComTag>& cctv = kv.second;
                // We need to fix the order so that the send and recv processes match.
                std::sort(cctv.begin(), cctv.end());
            }
        }
    }
}